

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cpp
# Opt level: O0

void pstore::exchange::export_ns::emit_database(database *db,ostream *os,bool comments)

{
  anon_class_32_4_aa1386db fn;
  indent ind_00;
  ostream_base *poVar1;
  header *this;
  const_iterator cVar2;
  const_iterator __last;
  difference_type dVar3;
  __normal_iterator<const_pstore::typed_address<pstore::trailer>_*,_std::vector<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>_>
  first;
  undefined1 local_100 [8];
  vector<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
  f;
  uuid local_d8 [2];
  indent local_b4;
  indent local_b0 [2];
  indent ind;
  undefined1 local_98 [8];
  string_mapping path_table;
  undefined1 local_58 [8];
  string_mapping string_table;
  bool comments_local;
  ostream *os_local;
  database *db_local;
  
  string_table.strings_._M_h._M_single_bucket._7_1_ = comments;
  name_index_tag();
  string_mapping::string_mapping<(pstore::trailer::indices)3>((string_mapping *)local_58,db);
  path_index_tag();
  string_mapping::string_mapping<(pstore::trailer::indices)4>((string_mapping *)local_98,db);
  local_b4.distance_ = 0;
  indent::indent(&local_b4);
  local_b0[0] = indent::next(&local_b4);
  operator<<(&os->super_ostream_base,"{\n");
  poVar1 = operator<<(&os->super_ostream_base,local_b0);
  poVar1 = operator<<(poVar1,"\"version\":1,");
  operator<<(poVar1,'\n');
  poVar1 = operator<<(&os->super_ostream_base,local_b0);
  poVar1 = operator<<(poVar1,"\"id\":\"");
  this = database::get_header(db);
  join_0x00000010_0x00000000_ = (_Type)header::id(this);
  uuid::str_abi_cxx11_(local_d8);
  poVar1 = operator<<(poVar1,(string *)local_d8);
  operator<<(poVar1,"\",\n");
  std::__cxx11::string::~string((string *)local_d8);
  poVar1 = operator<<(&os->super_ostream_base,local_b0);
  operator<<(poVar1,"\"transactions\":");
  anon_unknown.dwarf_4c98f::footers
            ((vector<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
              *)local_100,db);
  cVar2 = std::
          begin<std::vector<pstore::typed_address<pstore::trailer>,std::allocator<pstore::typed_address<pstore::trailer>>>>
                    ((vector<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
                      *)local_100);
  __last = std::
           end<std::vector<pstore::typed_address<pstore::trailer>,std::allocator<pstore::typed_address<pstore::trailer>>>>
                     ((vector<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
                       *)local_100);
  dVar3 = std::
          distance<__gnu_cxx::__normal_iterator<pstore::typed_address<pstore::trailer>const*,std::vector<pstore::typed_address<pstore::trailer>,std::allocator<pstore::typed_address<pstore::trailer>>>>>
                    ((__normal_iterator<const_pstore::typed_address<pstore::trailer>_*,_std::vector<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>_>
                      )cVar2._M_current,
                     (__normal_iterator<const_pstore::typed_address<pstore::trailer>_*,_std::vector<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>_>
                      )__last._M_current);
  ind_00.distance_ = local_b0[0].distance_;
  if (0 < dVar3) {
    cVar2 = std::
            begin<std::vector<pstore::typed_address<pstore::trailer>,std::allocator<pstore::typed_address<pstore::trailer>>>>
                      ((vector<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
                        *)local_100);
    first = std::
            next<__gnu_cxx::__normal_iterator<pstore::typed_address<pstore::trailer>const*,std::vector<pstore::typed_address<pstore::trailer>,std::allocator<pstore::typed_address<pstore::trailer>>>>>
                      ((__normal_iterator<const_pstore::typed_address<pstore::trailer>_*,_std::vector<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>_>
                        )cVar2._M_current,1);
    cVar2 = std::
            end<std::vector<pstore::typed_address<pstore::trailer>,std::allocator<pstore::typed_address<pstore::trailer>>>>
                      ((vector<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
                        *)local_100);
    fn.comments = (bool *)((long)&string_table.strings_._M_h._M_single_bucket + 7);
    fn.db = db;
    fn.string_table = (string_mapping *)local_58;
    fn.path_table = (string_mapping *)local_98;
    emit_array<pstore::exchange::export_ns::ostream,__gnu_cxx::__normal_iterator<pstore::typed_address<pstore::trailer>const*,std::vector<pstore::typed_address<pstore::trailer>,std::allocator<pstore::typed_address<pstore::trailer>>>>,pstore::exchange::export_ns::emit_database(pstore::database&,pstore::exchange::export_ns::ostream&,bool)::__0>
              (os,ind_00,first,
               (__normal_iterator<const_pstore::typed_address<pstore::trailer>_*,_std::vector<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>_>
                )cVar2._M_current,fn);
    operator<<(&os->super_ostream_base,"\n}\n");
    std::
    vector<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
    ::~vector((vector<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
               *)local_100);
    string_mapping::~string_mapping((string_mapping *)local_98);
    string_mapping::~string_mapping((string_mapping *)local_58);
    return;
  }
  assert_failed("std::distance (std::begin (f), std::end (f)) >= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/export.cpp"
                ,0x67);
}

Assistant:

void emit_database (database & db, ostream & os, bool const comments) {
                string_mapping string_table{db, name_index_tag ()};
                string_mapping path_table{db, path_index_tag ()};

                auto const ind = indent{}.next ();
                os << "{\n";
                os << ind << R"("version":1,)" << '\n';
                os << ind << R"("id":")" << db.get_header ().id ().str () << "\",\n";
                os << ind << R"("transactions":)";

                auto const f = footers (db);
                PSTORE_ASSERT (std::distance (std::begin (f), std::end (f)) >= 1);
                emit_array (
                    os, ind, std::next (std::begin (f)), std::end (f),
                    [&] (ostream & os1, indent const ind1,
                         pstore::typed_address<pstore::trailer> const footer_pos) {
                        auto const footer = db.getro (footer_pos);
                        unsigned const generation = footer->a.generation;
                        db.sync (generation);
                        os1 << ind1 << "{\n";
                        auto const object_indent = ind1.next ();
                        if (comments) {
                            os1 << object_indent << "// transaction #" << generation << '\n';
                        }
                        bool const names_emitted = emit_strings<trailer::indices::name> (
                            os1, object_indent, db, generation,
                            prefix (false, object_indent, "names"), &string_table, comments);
                        bool const paths_emitted = emit_strings<trailer::indices::path> (
                            os1, object_indent, db, generation,
                            prefix (names_emitted, object_indent, "paths"), &path_table, comments);
                        if (paths_emitted || names_emitted) {
                            os1 << ",\n";
                        }
                        if (emit_debug_line_headers (os1, object_indent, db, generation)) {
                            os1 << ",\n";
                        }
                        os1 << object_indent << R"("fragments":{)";
                        emit_fragments (os1, object_indent.next (), db, generation, string_table,
                                        comments);
                        os1 << '\n' << object_indent << "},\n";
                        os1 << object_indent << R"("compilations":{)";
                        emit_compilation_index (os1, object_indent.next (), db, generation,
                                                string_table, comments);
                        os1 << '\n' << object_indent << "}\n";
                        os1 << ind1 << '}';
                    });
                os << "\n}\n";
            }